

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QMimeType>::relocate
          (QArrayDataPointer<QMimeType> *this,qsizetype offset,QMimeType **data)

{
  bool bVar1;
  QMimeType *first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  QMimeType *res;
  
  first = (QMimeType *)(*(long *)(in_RDI + 8) + in_RSI * 8);
  QtPrivate::q_relocate_overlap_n<QMimeType,long_long>(first,in_RDI,(QMimeType *)0x8eca07);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::q_points_into_range<QArrayDataPointer<QMimeType>,QMimeType_const*>
                        (data,(QArrayDataPointer<QMimeType> *)res), bVar1)) {
    *in_RDX = in_RSI * 8 + *in_RDX;
  }
  *(QMimeType **)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }